

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O2

void __thiscall
pbrt::SobolSampler::SobolSampler
          (SobolSampler *this,int spp,Point2i *fullResolution,RandomizeStrategy randomizeStrategy)

{
  int iVar1;
  int32_t iVar2;
  int v;
  
  iVar2 = RoundUpPow2(spp);
  this->samplesPerPixel = iVar2;
  this->randomizeStrategy = randomizeStrategy;
  (this->pixel).super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)0x0;
  this->dimension = 0;
  if (POPCOUNT(spp) != 1) {
    Warning<int&>("Non power-of-two sample count rounded up to %d for SobolSampler.",
                  &this->samplesPerPixel);
  }
  iVar1 = (fullResolution->super_Tuple2<pbrt::Point2,_int>).x;
  v = (fullResolution->super_Tuple2<pbrt::Point2,_int>).y;
  if (v < iVar1) {
    v = iVar1;
  }
  iVar2 = RoundUpPow2(v);
  this->resolution = iVar2;
  return;
}

Assistant:

SobolSampler(int spp, const Point2i &fullResolution,
                 RandomizeStrategy randomizeStrategy)
        : samplesPerPixel(RoundUpPow2(spp)), randomizeStrategy(randomizeStrategy) {
        if (!IsPowerOf2(spp))
            Warning("Non power-of-two sample count rounded up to %d "
                    "for SobolSampler.",
                    samplesPerPixel);
        resolution = RoundUpPow2(std::max(fullResolution.x, fullResolution.y));
    }